

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

mg_context * mg_start2(mg_init_data *init,mg_error_data *error)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint64_t uVar6;
  ulong uVar7;
  uint *puVar8;
  char *pcVar9;
  socket *psVar10;
  pthread_t *ppVar11;
  mg_connection *pmVar12;
  long lVar13;
  char *pcVar14;
  bool bVar15;
  void *local_e0;
  char **local_d8;
  long error_no;
  char *err_msg_6;
  char *err_msg_5;
  char *err_msg_4;
  char *err_msg_3;
  char *err_msg_2;
  char *err_msg_1;
  char *err_msg;
  undefined4 local_88;
  uint error_id;
  mg_workerTLS tls;
  char **options;
  _func_void_mg_context_ptr *exit_callback;
  uint local_50;
  int itmp;
  uint i;
  int workerthreadcount;
  int ok;
  int idx;
  char *default_value;
  char *value;
  char *name;
  mg_context *ctx;
  mg_error_data *error_local;
  mg_init_data *init_local;
  
  options = (char **)0x0;
  if (init == (mg_init_data *)0x0) {
    local_d8 = (char **)0x0;
  }
  else {
    local_d8 = init->configuration_options;
  }
  tls.alpn_proto = (char *)local_d8;
  if (error != (mg_error_data *)0x0) {
    error->code = 0;
    error->code_sub = 0;
    if (error->text_buffer_size != 0) {
      *error->text = '\0';
    }
  }
  if (mg_init_library_called == 0) {
    legacy_init(local_d8);
  }
  if (mg_init_library_called == 0) {
    if (error != (mg_error_data *)0x0) {
      error->code = 8;
      mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,"%s",
                  "Library uninitialized");
    }
    init_local = (mg_init_data *)0x0;
  }
  else {
    init_local = (mg_init_data *)mg_calloc(1,0x285a8);
    if ((mg_context *)init_local == (mg_context *)0x0) {
      if (error != (mg_error_data *)0x0) {
        error->code = 6;
        error->code_sub = 0x285a8;
        mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,"%s",
                    "Out of memory");
      }
      init_local = (mg_init_data *)0x0;
    }
    else {
      uVar6 = get_random();
      (((mg_context *)init_local)->dd).auth_nonce_mask = uVar6 ^ (ulong)tls.alpn_proto;
      uVar7 = mg_atomic_inc(&thread_idx_max);
      ((mg_context *)init_local)->starter_thread_idx = uVar7 & 0xffffffff;
      local_88 = 0xffffffff;
      tls._0_8_ = ((mg_context *)init_local)->starter_thread_idx;
      pthread_setspecific(sTlsKey,&local_88);
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&((mg_context *)init_local)->thread_mutex,
                                 (pthread_mutexattr_t *)&pthread_mutex_attr);
      iVar2 = pthread_cond_init((pthread_cond_t *)&((mg_context *)init_local)->sq_empty,
                                (pthread_condattr_t *)0x0);
      iVar3 = pthread_cond_init((pthread_cond_t *)&((mg_context *)init_local)->sq_full,
                                (pthread_condattr_t *)0x0);
      ((mg_context *)init_local)->sq_blocked = 0;
      iVar4 = pthread_mutex_init((pthread_mutex_t *)&((mg_context *)init_local)->nonce_mutex,
                                 (pthread_mutexattr_t *)&pthread_mutex_attr);
      if (iVar4 == 0 && (iVar3 == 0 && (iVar2 == 0 && iVar1 == 0))) {
        if ((init != (mg_init_data *)0x0) && (init->callbacks != (mg_callbacks *)0x0)) {
          memcpy(&((mg_context *)init_local)->callbacks,init->callbacks,0x90);
          options = (char **)init->callbacks->exit_context;
          (((mg_context *)init_local)->callbacks).exit_context = (_func_void_mg_context_ptr *)0x0;
        }
        if (init == (mg_init_data *)0x0) {
          local_e0 = (void *)0x0;
        }
        else {
          local_e0 = init->user_data;
        }
        ((mg_context *)init_local)->user_data = local_e0;
        (((mg_context *)init_local)->dd).handlers = (mg_handler_info *)0x0;
        (((mg_context *)init_local)->dd).next = (mg_domain_context *)0x0;
        while( true ) {
          bVar15 = false;
          if (tls.alpn_proto != (char *)0x0) {
            value = *(char **)tls.alpn_proto;
            bVar15 = value != (char *)0x0;
            tls.alpn_proto = tls.alpn_proto + 8;
          }
          if (!bVar15) break;
          uVar5 = get_option_index(value);
          if (uVar5 == 0xffffffff) {
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,(mg_context *)init_local,"mg_start2",0x506e,
                       "Invalid option: %s",value);
            if (error != (mg_error_data *)0x0) {
              error->code = 2;
              error->code_sub = 0xffffffff;
              mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,
                          "Invalid configuration option: %s",value);
            }
            free_context((mg_context *)init_local);
            pthread_setspecific(sTlsKey,(void *)0x0);
            return (mg_context *)0x0;
          }
          pcVar14 = tls.alpn_proto + 8;
          pcVar9 = *(char **)tls.alpn_proto;
          tls.alpn_proto = pcVar14;
          if (pcVar9 == (char *)0x0) {
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,(mg_context *)init_local,"mg_start2",0x507f,
                       "%s: option value cannot be NULL",value);
            if (error != (mg_error_data *)0x0) {
              error->code = 2;
              error->code_sub = uVar5;
              mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,
                          "Invalid configuration option value: %s",value);
            }
            free_context((mg_context *)init_local);
            pthread_setspecific(sTlsKey,(void *)0x0);
            return (mg_context *)0x0;
          }
          if ((((mg_context *)init_local)->dd).config[(int)uVar5] != (char *)0x0) {
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,(mg_context *)init_local,"mg_start2",0x5092,
                       "warning: %s: duplicate option",value);
            mg_free((((mg_context *)init_local)->dd).config[(int)uVar5]);
          }
          pcVar9 = mg_strdup_ctx(pcVar9,(mg_context *)init_local);
          (((mg_context *)init_local)->dd).config[(int)uVar5] = pcVar9;
        }
        local_50 = 0;
        while (config_options[local_50].name != (char *)0x0) {
          if (((((mg_context *)init_local)->dd).config[local_50] == (char *)0x0) &&
             (config_options[local_50].default_value != (char *)0x0)) {
            pcVar9 = mg_strdup_ctx(config_options[local_50].default_value,(mg_context *)init_local);
            (((mg_context *)init_local)->dd).config[local_50] = pcVar9;
          }
          local_50 = local_50 + 1;
        }
        uVar5 = atoi((((mg_context *)init_local)->dd).config[4]);
        if ((int)uVar5 < 0x400) {
          mg_cry_internal_wrap
                    ((mg_connection *)0x0,(mg_context *)init_local,"mg_start2",0x50a6,"%s too small"
                     ,"max_request_size");
          if (error != (mg_error_data *)0x0) {
            error->code = 2;
            error->code_sub = 4;
            mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,
                        "Invalid configuration option value: %s","max_request_size");
          }
          free_context((mg_context *)init_local);
          pthread_setspecific(sTlsKey,(void *)0x0);
          init_local = (mg_init_data *)0x0;
        }
        else {
          ((mg_context *)init_local)->max_request_size = uVar5;
          uVar5 = atoi((((mg_context *)init_local)->dd).config[6]);
          if ((int)uVar5 < 1) {
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,(mg_context *)init_local,"mg_start2",0x50be,
                       "%s too small","connection_queue");
            if (error != (mg_error_data *)0x0) {
              error->code = 2;
              error->code_sub = 6;
              mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,
                          "Invalid configuration option value: %s","connection_queue");
            }
            free_context((mg_context *)init_local);
            pthread_setspecific(sTlsKey,(void *)0x0);
            return (mg_context *)0x0;
          }
          psVar10 = (socket *)mg_calloc((ulong)uVar5,0x40);
          ((mg_context *)init_local)->squeue = psVar10;
          if (((mg_context *)init_local)->squeue == (socket *)0x0) {
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,(mg_context *)init_local,"mg_start2",0x50d3,
                       "Out of memory: Cannot allocate %s","connection_queue");
            if (error != (mg_error_data *)0x0) {
              error->code = 6;
              error->code_sub = uVar5 << 6;
              mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,
                          "Out of memory: Cannot allocate %s","connection_queue");
            }
            free_context((mg_context *)init_local);
            pthread_setspecific(sTlsKey,(void *)0x0);
            init_local = (mg_init_data *)0x0;
          }
          else {
            ((mg_context *)init_local)->sq_size = uVar5;
            uVar5 = atoi((((mg_context *)init_local)->dd).config[1]);
            if (((int)uVar5 < 0x10001) && (0 < (int)uVar5)) {
              if ((((mg_context *)init_local)->dd).config[0xf] == (char *)0x0) {
                get_system_name(&((mg_context *)init_local)->systemName);
                iVar1 = set_gpass_option((mg_context *)init_local,(mg_domain_context *)0x0);
                if (iVar1 == 0) {
                  mg_cry_internal_wrap
                            ((mg_connection *)0x0,(mg_context *)init_local,"mg_start2",0x5176,"%s",
                             "Invalid global password file");
                  if (error != (mg_error_data *)0x0) {
                    error->code = 0xd;
                    mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,
                                "%s","Invalid global password file");
                  }
                  free_context((mg_context *)init_local);
                  pthread_setspecific(sTlsKey,(void *)0x0);
                  init_local = (mg_init_data *)0x0;
                }
                else {
                  iVar1 = set_ports_option((mg_context *)init_local);
                  if (iVar1 == 0) {
                    mg_cry_internal_wrap
                              ((mg_connection *)0x0,(mg_context *)init_local,"mg_start2",0x51b5,"%s"
                               ,"Failed to setup server ports");
                    if (error != (mg_error_data *)0x0) {
                      error->code = 10;
                      mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,
                                  error->text_buffer_size,"%s","Failed to setup server ports");
                    }
                    free_context((mg_context *)init_local);
                    pthread_setspecific(sTlsKey,(void *)0x0);
                    init_local = (mg_init_data *)0x0;
                  }
                  else {
                    iVar1 = set_uid_option((mg_context *)init_local);
                    if (iVar1 == 0) {
                      mg_cry_internal_wrap
                                ((mg_connection *)0x0,(mg_context *)init_local,"mg_start2",0x51ca,
                                 "%s","Failed to run as configured user");
                      if (error != (mg_error_data *)0x0) {
                        error->code = 0xb;
                        mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,
                                    error->text_buffer_size,"%s","Failed to run as configured user")
                        ;
                      }
                      free_context((mg_context *)init_local);
                      pthread_setspecific(sTlsKey,(void *)0x0);
                      init_local = (mg_init_data *)0x0;
                    }
                    else {
                      iVar1 = set_acl_option((mg_context *)init_local);
                      if (iVar1 == 0) {
                        mg_cry_internal_wrap
                                  ((mg_connection *)0x0,(mg_context *)init_local,"mg_start2",0x51df,
                                   "%s","Failed to setup access control list");
                        if (error != (mg_error_data *)0x0) {
                          error->code = 0xc;
                          mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,
                                      error->text_buffer_size,"%s",
                                      "Failed to setup access control list");
                        }
                        free_context((mg_context *)init_local);
                        pthread_setspecific(sTlsKey,(void *)0x0);
                        init_local = (mg_init_data *)0x0;
                      }
                      else {
                        ((mg_context *)init_local)->cfg_worker_threads = uVar5;
                        ppVar11 = (pthread_t *)
                                  mg_calloc((ulong)((mg_context *)init_local)->cfg_worker_threads,8)
                        ;
                        ((mg_context *)init_local)->worker_threadids = ppVar11;
                        if (((mg_context *)init_local)->worker_threadids == (pthread_t *)0x0) {
                          mg_cry_internal_wrap
                                    ((mg_connection *)0x0,(mg_context *)init_local,"mg_start2",
                                     0x51f7,"%s","Not enough memory for worker thread ID array");
                          if (error != (mg_error_data *)0x0) {
                            error->code = 6;
                            error->code_sub = ((mg_context *)init_local)->cfg_worker_threads << 3;
                            mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,
                                        error->text_buffer_size,"%s",
                                        "Not enough memory for worker thread ID array");
                          }
                          free_context((mg_context *)init_local);
                          pthread_setspecific(sTlsKey,(void *)0x0);
                          init_local = (mg_init_data *)0x0;
                        }
                        else {
                          pmVar12 = (mg_connection *)
                                    mg_calloc((ulong)((mg_context *)init_local)->cfg_worker_threads,
                                              0x9e8);
                          ((mg_context *)init_local)->worker_connections = pmVar12;
                          if (((mg_context *)init_local)->worker_connections == (mg_connection *)0x0
                             ) {
                            mg_cry_internal_wrap
                                      ((mg_connection *)0x0,(mg_context *)init_local,"mg_start2",
                                       0x5210,"%s",
                                       "Not enough memory for worker thread connection array");
                            if (error != (mg_error_data *)0x0) {
                              error->code = 6;
                              error->code_sub =
                                   ((mg_context *)init_local)->cfg_worker_threads * 0x9e8;
                              mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,
                                          error->text_buffer_size,"%s",
                                          "Not enough memory for worker thread connection array");
                            }
                            free_context((mg_context *)init_local);
                            pthread_setspecific(sTlsKey,(void *)0x0);
                            init_local = (mg_init_data *)0x0;
                          }
                          else {
                            if ((((mg_context *)init_local)->callbacks).init_context !=
                                (_func_void_mg_context_ptr *)0x0) {
                              (*(((mg_context *)init_local)->callbacks).init_context)
                                        ((mg_context *)init_local);
                            }
                            (((mg_context *)init_local)->callbacks).exit_context =
                                 (_func_void_mg_context_ptr *)options;
                            ((mg_context *)init_local)->context_type = 1;
                            for (local_50 = 0;
                                local_50 < ((mg_context *)init_local)->cfg_worker_threads;
                                local_50 = local_50 + 1) {
                              ((mg_context *)init_local)->worker_connections[local_50].phys_ctx =
                                   (mg_context *)init_local;
                              iVar1 = mg_start_thread_with_id
                                                (worker_thread,
                                                 ((mg_context *)init_local)->worker_connections +
                                                 local_50,((mg_context *)init_local)->
                                                          worker_threadids + local_50);
                              if (iVar1 != 0) {
                                puVar8 = (uint *)__errno_location();
                                uVar5 = *puVar8;
                                lVar13 = (long)(int)uVar5;
                                if (local_50 == 0) {
                                  mg_cry_internal_wrap
                                            ((mg_connection *)0x0,(mg_context *)init_local,
                                             "mg_start2",0x52b6,"Cannot create threads: error %ld",
                                             lVar13);
                                  if (error != (mg_error_data *)0x0) {
                                    error->code = 9;
                                    error->code_sub = uVar5;
                                    mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,
                                                error->text_buffer_size,
                                                "Cannot create first worker thread: error %ld",
                                                lVar13);
                                  }
                                  free_context((mg_context *)init_local);
                                  pthread_setspecific(sTlsKey,(void *)0x0);
                                  return (mg_context *)0x0;
                                }
                                mg_cry_internal_wrap
                                          ((mg_connection *)0x0,(mg_context *)init_local,"mg_start2"
                                           ,0x52aa,"Cannot start worker thread %i: error %ld",
                                           (ulong)(local_50 + 1),lVar13);
                                break;
                              }
                            }
                            mg_start_thread_with_id
                                      (master_thread,init_local,
                                       &((mg_context *)init_local)->masterthreadid);
                            pthread_setspecific(sTlsKey,(void *)0x0);
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                mg_cry_internal_wrap
                          ((mg_connection *)0x0,(mg_context *)init_local,"mg_start2",0x5102,"%s",
                           "Document root must not be set");
                if (error != (mg_error_data *)0x0) {
                  error->code = 2;
                  error->code_sub = 0xf;
                  mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,
                              "Invalid configuration option value: %s","document_root");
                }
                free_context((mg_context *)init_local);
                pthread_setspecific(sTlsKey,(void *)0x0);
                init_local = (mg_init_data *)0x0;
              }
            }
            else {
              if ((int)uVar5 < 1) {
                mg_cry_internal_wrap
                          ((mg_connection *)0x0,(mg_context *)init_local,"mg_start2",0x50eb,"%s",
                           "Invalid number of worker threads");
              }
              else {
                mg_cry_internal_wrap
                          ((mg_connection *)0x0,(mg_context *)init_local,"mg_start2",0x50ed,"%s",
                           "Too many worker threads");
              }
              if (error != (mg_error_data *)0x0) {
                error->code = 2;
                error->code_sub = 1;
                mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,
                            "Invalid configuration option value: %s","num_threads");
              }
              free_context((mg_context *)init_local);
              pthread_setspecific(sTlsKey,(void *)0x0);
              init_local = (mg_init_data *)0x0;
            }
          }
        }
      }
      else {
        puVar8 = (uint *)__errno_location();
        uVar5 = *puVar8;
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,(mg_context *)init_local,"mg_start2",0x5048,"%s",
                   "Cannot initialize thread synchronization objects");
        if (error != (mg_error_data *)0x0) {
          error->code = 9;
          error->code_sub = uVar5;
          mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,"%s",
                      "Cannot initialize thread synchronization objects");
        }
        mg_free(init_local);
        pthread_setspecific(sTlsKey,(void *)0x0);
        init_local = (mg_init_data *)0x0;
      }
    }
  }
  return (mg_context *)init_local;
}

Assistant:

mg_context *
mg_start2(struct mg_init_data *init, struct mg_error_data *error)
{
	struct mg_context *ctx;
	const char *name, *value, *default_value;
	int idx, ok, workerthreadcount;
	unsigned int i;
	int itmp;
	void (*exit_callback)(const struct mg_context *ctx) = 0;
	const char **options =
	    ((init != NULL) ? (init->configuration_options) : (NULL));

	struct mg_workerTLS tls;

	if (error != NULL) {
		error->code = MG_ERROR_DATA_CODE_OK;
		error->code_sub = 0;
		if (error->text_buffer_size > 0) {
			*error->text = 0;
		}
	}

	if (mg_init_library_called == 0) {
		/* Legacy INIT, if mg_start is called without mg_init_library.
		 * Note: This will cause a memory leak when unloading the library.
		 */
		legacy_init(options);
	}
	if (mg_init_library_called == 0) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_LIBRARY_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Library uninitialized");
		}
		return NULL;
	}

	/* Allocate context and initialize reasonable general case defaults. */
	ctx = (struct mg_context *)mg_calloc(1, sizeof(*ctx));
	if (ctx == NULL) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)sizeof(*ctx);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Out of memory");
		}
		return NULL;
	}

	/* Random number generator will initialize at the first call */
	ctx->dd.auth_nonce_mask =
	    (uint64_t)get_random() ^ (uint64_t)(ptrdiff_t)(options);

	/* Save started thread index to reuse in other external API calls
	 * For the sake of thread synchronization all non-civetweb threads
	 * can be considered as single external thread */
	ctx->starter_thread_idx = (unsigned)mg_atomic_inc(&thread_idx_max);
	tls.is_master = -1; /* Thread calling mg_start */
	tls.thread_idx = ctx->starter_thread_idx;
#if defined(_WIN32)
	tls.pthread_cond_helper_mutex = NULL;
#endif
	pthread_setspecific(sTlsKey, &tls);

	ok = (0 == pthread_mutex_init(&ctx->thread_mutex, &pthread_mutex_attr));
#if !defined(ALTERNATIVE_QUEUE)
	ok &= (0 == pthread_cond_init(&ctx->sq_empty, NULL));
	ok &= (0 == pthread_cond_init(&ctx->sq_full, NULL));
	ctx->sq_blocked = 0;
#endif
	ok &= (0 == pthread_mutex_init(&ctx->nonce_mutex, &pthread_mutex_attr));
#if defined(USE_LUA)
	ok &= (0 == pthread_mutex_init(&ctx->lua_bg_mutex, &pthread_mutex_attr));
#endif
	if (!ok) {
		unsigned error_id = (unsigned)ERRNO;
		const char *err_msg =
		    "Cannot initialize thread synchronization objects";
		/* Fatal error - abort start. However, this situation should never
		 * occur in practice. */

		mg_cry_ctx_internal(ctx, "%s", err_msg);
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OS_ERROR;
			error->code_sub = error_id;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		mg_free(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

	if ((init != NULL) && (init->callbacks != NULL)) {
		/* Set all callbacks except exit_context. */
		ctx->callbacks = *init->callbacks;
		exit_callback = init->callbacks->exit_context;
		/* The exit callback is activated once the context is successfully
		 * created. It should not be called, if an incomplete context object
		 * is deleted during a failed initialization. */
		ctx->callbacks.exit_context = 0;
	}
	ctx->user_data = ((init != NULL) ? (init->user_data) : (NULL));
	ctx->dd.handlers = NULL;
	ctx->dd.next = NULL;

#if defined(USE_LUA)
	lua_ctx_init(ctx);
#endif

	/* Store options */
	while (options && (name = *options++) != NULL) {
		idx = get_option_index(name);
		if (idx == -1) {
			mg_cry_ctx_internal(ctx, "Invalid option: %s", name);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
				error->code_sub = (unsigned)-1;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Invalid configuration option: %s",
				            name);
			}

			free_context(ctx);
			pthread_setspecific(sTlsKey, NULL);
			return NULL;

		} else if ((value = *options++) == NULL) {
			mg_cry_ctx_internal(ctx, "%s: option value cannot be NULL", name);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
				error->code_sub = (unsigned)idx;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Invalid configuration option value: %s",
				            name);
			}

			free_context(ctx);
			pthread_setspecific(sTlsKey, NULL);
			return NULL;
		}
		if (ctx->dd.config[idx] != NULL) {
			/* A duplicate configuration option is not an error - the last
			 * option value will be used. */
			mg_cry_ctx_internal(ctx, "warning: %s: duplicate option", name);
			mg_free(ctx->dd.config[idx]);
		}
		ctx->dd.config[idx] = mg_strdup_ctx(value, ctx);
		DEBUG_TRACE("[%s] -> [%s]", name, value);
	}

	/* Set default value if needed */
	for (i = 0; config_options[i].name != NULL; i++) {
		default_value = config_options[i].default_value;
		if ((ctx->dd.config[i] == NULL) && (default_value != NULL)) {
			ctx->dd.config[i] = mg_strdup_ctx(default_value, ctx);
		}
	}

	/* Request size option */
	itmp = atoi(ctx->dd.config[MAX_REQUEST_SIZE]);
	if (itmp < 1024) {
		mg_cry_ctx_internal(ctx,
		                    "%s too small",
		                    config_options[MAX_REQUEST_SIZE].name);
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
			error->code_sub = (unsigned)MAX_REQUEST_SIZE;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Invalid configuration option value: %s",
			            config_options[MAX_REQUEST_SIZE].name);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
	ctx->max_request_size = (unsigned)itmp;

	/* Queue length */
#if !defined(ALTERNATIVE_QUEUE)
	itmp = atoi(ctx->dd.config[CONNECTION_QUEUE_SIZE]);
	if (itmp < 1) {
		mg_cry_ctx_internal(ctx,
		                    "%s too small",
		                    config_options[CONNECTION_QUEUE_SIZE].name);
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
			error->code_sub = CONNECTION_QUEUE_SIZE;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Invalid configuration option value: %s",
			            config_options[CONNECTION_QUEUE_SIZE].name);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
	ctx->squeue =
	    (struct socket *)mg_calloc((unsigned int)itmp, sizeof(struct socket));
	if (ctx->squeue == NULL) {
		mg_cry_ctx_internal(ctx,
		                    "Out of memory: Cannot allocate %s",
		                    config_options[CONNECTION_QUEUE_SIZE].name);
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)itmp * (unsigned)sizeof(struct socket);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Out of memory: Cannot allocate %s",
			            config_options[CONNECTION_QUEUE_SIZE].name);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
	ctx->sq_size = itmp;
#endif

	/* Worker thread count option */
	workerthreadcount = atoi(ctx->dd.config[NUM_THREADS]);

	if ((workerthreadcount > MAX_WORKER_THREADS) || (workerthreadcount <= 0)) {
		if (workerthreadcount <= 0) {
			mg_cry_ctx_internal(ctx, "%s", "Invalid number of worker threads");
		} else {
			mg_cry_ctx_internal(ctx, "%s", "Too many worker threads");
		}
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
			error->code_sub = NUM_THREADS;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Invalid configuration option value: %s",
			            config_options[NUM_THREADS].name);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

	/* Document root */
#if defined(NO_FILES)
	if (ctx->dd.config[DOCUMENT_ROOT] != NULL) {
		mg_cry_ctx_internal(ctx, "%s", "Document root must not be set");
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
			error->code_sub = (unsigned)DOCUMENT_ROOT;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Invalid configuration option value: %s",
			            config_options[DOCUMENT_ROOT].name);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
#endif

	get_system_name(&ctx->systemName);

#if defined(USE_LUA)
	/* If a Lua background script has been configured, start it. */
	ctx->lua_bg_log_available = 0;
	if (ctx->dd.config[LUA_BACKGROUND_SCRIPT] != NULL) {
		char ebuf[256];
		struct vec opt_vec;
		struct vec eq_vec;
		const char *sparams;

		memset(ebuf, 0, sizeof(ebuf));
		pthread_mutex_lock(&ctx->lua_bg_mutex);

		/* Create a Lua state, load all standard libraries and the mg table */
		lua_State *state = mg_lua_context_script_prepare(
		    ctx->dd.config[LUA_BACKGROUND_SCRIPT], ctx, ebuf, sizeof(ebuf));
		if (!state) {
			mg_cry_ctx_internal(ctx,
			                    "lua_background_script load error: %s",
			                    ebuf);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_SCRIPT_ERROR;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Error in script %s: %s",
				            config_options[LUA_BACKGROUND_SCRIPT].name,
				            ebuf);
			}

			pthread_mutex_unlock(&ctx->lua_bg_mutex);

			free_context(ctx);
			pthread_setspecific(sTlsKey, NULL);
			return NULL;
		}

		/* Add a table with parameters into mg.params */
		sparams = ctx->dd.config[LUA_BACKGROUND_SCRIPT_PARAMS];
		if (sparams && sparams[0]) {
			lua_getglobal(state, "mg");
			lua_pushstring(state, "params");
			lua_newtable(state);

			while ((sparams = next_option(sparams, &opt_vec, &eq_vec))
			       != NULL) {
				reg_llstring(
				    state, opt_vec.ptr, opt_vec.len, eq_vec.ptr, eq_vec.len);
				if (mg_strncasecmp(sparams, opt_vec.ptr, opt_vec.len) == 0)
					break;
			}
			lua_rawset(state, -3);
			lua_pop(state, 1);
		}

		/* Call script */
		state = mg_lua_context_script_run(state,
		                                  ctx->dd.config[LUA_BACKGROUND_SCRIPT],
		                                  ctx,
		                                  ebuf,
		                                  sizeof(ebuf));
		if (!state) {
			mg_cry_ctx_internal(ctx,
			                    "lua_background_script start error: %s",
			                    ebuf);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_SCRIPT_ERROR;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Error in script %s: %s",
				            config_options[DOCUMENT_ROOT].name,
				            ebuf);
			}
			pthread_mutex_unlock(&ctx->lua_bg_mutex);

			free_context(ctx);
			pthread_setspecific(sTlsKey, NULL);
			return NULL;
		}

		/* state remains valid */
		ctx->lua_background_state = (void *)state;
		pthread_mutex_unlock(&ctx->lua_bg_mutex);

	} else {
		ctx->lua_background_state = 0;
	}
#endif

	/* Step by step initialization of ctx - depending on build options */
#if !defined(NO_FILESYSTEMS)
	if (!set_gpass_option(ctx, NULL)) {
		const char *err_msg = "Invalid global password file";
		/* Fatal error - abort start. */
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_PASS_FILE;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}
		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
#endif

#if defined(USE_MBEDTLS)
	if (!mg_sslctx_init(ctx, NULL)) {
		const char *err_msg = "Error initializing SSL context";
		/* Fatal error - abort start. */
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_TLS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

#elif !defined(NO_SSL)
	if (!init_ssl_ctx(ctx, NULL)) {
		const char *err_msg = "Error initializing SSL context";
		/* Fatal error - abort start. */
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_TLS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
#endif

	if (!set_ports_option(ctx)) {
		const char *err_msg = "Failed to setup server ports";
		/* Fatal error - abort start. */
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_PORTS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

#if !defined(_WIN32) && !defined(__ZEPHYR__)
	if (!set_uid_option(ctx)) {
		const char *err_msg = "Failed to run as configured user";
		/* Fatal error - abort start. */
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_USER_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
#endif

	if (!set_acl_option(ctx)) {
		const char *err_msg = "Failed to setup access control list";
		/* Fatal error - abort start. */
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_ACL_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

	ctx->cfg_worker_threads = ((unsigned int)(workerthreadcount));
	ctx->worker_threadids = (pthread_t *)mg_calloc_ctx(ctx->cfg_worker_threads,
	                                                   sizeof(pthread_t),
	                                                   ctx);

	if (ctx->worker_threadids == NULL) {
		const char *err_msg = "Not enough memory for worker thread ID array";
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub =
			    (unsigned)ctx->cfg_worker_threads * (unsigned)sizeof(pthread_t);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
	ctx->worker_connections =
	    (struct mg_connection *)mg_calloc_ctx(ctx->cfg_worker_threads,
	                                          sizeof(struct mg_connection),
	                                          ctx);
	if (ctx->worker_connections == NULL) {
		const char *err_msg =
		    "Not enough memory for worker thread connection array";
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)ctx->cfg_worker_threads
			                  * (unsigned)sizeof(struct mg_connection);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

#if defined(ALTERNATIVE_QUEUE)
	ctx->client_wait_events =
	    (void **)mg_calloc_ctx(ctx->cfg_worker_threads,
	                           sizeof(ctx->client_wait_events[0]),
	                           ctx);
	if (ctx->client_wait_events == NULL) {
		const char *err_msg = "Not enough memory for worker event array";
		mg_cry_ctx_internal(ctx, "%s", err_msg);
		mg_free(ctx->worker_threadids);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)ctx->cfg_worker_threads
			                  * (unsigned)sizeof(ctx->client_wait_events[0]);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

	ctx->client_socks =
	    (struct socket *)mg_calloc_ctx(ctx->cfg_worker_threads,
	                                   sizeof(ctx->client_socks[0]),
	                                   ctx);
	if (ctx->client_socks == NULL) {
		const char *err_msg = "Not enough memory for worker socket array";
		mg_cry_ctx_internal(ctx, "%s", err_msg);
		mg_free(ctx->client_wait_events);
		mg_free(ctx->worker_threadids);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)ctx->cfg_worker_threads
			                  * (unsigned)sizeof(ctx->client_socks[0]);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

	for (i = 0; (unsigned)i < ctx->cfg_worker_threads; i++) {
		ctx->client_wait_events[i] = event_create();
		if (ctx->client_wait_events[i] == 0) {
			const char *err_msg = "Error creating worker event %i";
			mg_cry_ctx_internal(ctx, err_msg, i);
			while (i > 0) {
				i--;
				event_destroy(ctx->client_wait_events[i]);
			}
			mg_free(ctx->client_socks);
			mg_free(ctx->client_wait_events);
			mg_free(ctx->worker_threadids);

			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_OS_ERROR;
				error->code_sub = (unsigned)ERRNO;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            err_msg,
				            i);
			}

			free_context(ctx);
			pthread_setspecific(sTlsKey, NULL);
			return NULL;
		}
	}
#endif

#if defined(USE_TIMERS)
	if (timers_init(ctx) != 0) {
		const char *err_msg = "Error creating timers";
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OS_ERROR;
			error->code_sub = (unsigned)ERRNO;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
#endif

	/* Context has been created - init user libraries */
	if (ctx->callbacks.init_context) {
		ctx->callbacks.init_context(ctx);
	}

	/* From now, the context is successfully created.
	 * When it is destroyed, the exit callback should be called. */
	ctx->callbacks.exit_context = exit_callback;
	ctx->context_type = CONTEXT_SERVER; /* server context */

	/* Start worker threads */
	for (i = 0; i < ctx->cfg_worker_threads; i++) {
		/* worker_thread sets up the other fields */
		ctx->worker_connections[i].phys_ctx = ctx;
		if (mg_start_thread_with_id(worker_thread,
		                            &ctx->worker_connections[i],
		                            &ctx->worker_threadids[i])
		    != 0) {

			long error_no = (long)ERRNO;

			/* thread was not created */
			if (i > 0) {
				/* If the second, third, ... thread cannot be created, set a
				 * warning, but keep running. */
				mg_cry_ctx_internal(ctx,
				                    "Cannot start worker thread %i: error %ld",
				                    i + 1,
				                    error_no);

				/* If the server initialization should stop here, all
				 * threads that have already been created must be stopped
				 * first, before any free_context(ctx) call.
				 */

			} else {
				/* If the first worker thread cannot be created, stop
				 * initialization and free the entire server context. */
				mg_cry_ctx_internal(ctx,
				                    "Cannot create threads: error %ld",
				                    error_no);

				if (error != NULL) {
					error->code = MG_ERROR_DATA_CODE_OS_ERROR;
					error->code_sub = (unsigned)error_no;
					mg_snprintf(
					    NULL,
					    NULL, /* No truncation check for error buffers */
					    error->text,
					    error->text_buffer_size,
					    "Cannot create first worker thread: error %ld",
					    error_no);
				}

				free_context(ctx);
				pthread_setspecific(sTlsKey, NULL);
				return NULL;
			}
			break;
		}
	}

	/* Start master (listening) thread */
	mg_start_thread_with_id(master_thread, ctx, &ctx->masterthreadid);

	pthread_setspecific(sTlsKey, NULL);
	return ctx;
}